

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__pnm_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  int iVar3;
  char c;
  stbi_uc local_29;
  
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if ((byte)(sVar2 - 0x37) < 0xfe || sVar1 != 'P') {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  else {
    if (comp != (int *)0x0) {
      *comp = (uint)(sVar2 == '6') * 2 + 1;
    }
    local_29 = stbi__get8(s);
    stbi__pnm_skip_whitespace(s,(char *)&local_29);
    iVar3 = stbi__pnm_getinteger(s,(char *)&local_29);
    if (x != (int *)0x0) {
      *x = iVar3;
    }
    stbi__pnm_skip_whitespace(s,(char *)&local_29);
    iVar3 = stbi__pnm_getinteger(s,(char *)&local_29);
    if (y != (int *)0x0) {
      *y = iVar3;
    }
    stbi__pnm_skip_whitespace(s,(char *)&local_29);
    iVar3 = stbi__pnm_getinteger(s,(char *)&local_29);
    if (iVar3 < 0x100) {
      return 1;
    }
    stbi__g_failure_reason = "max value > 255";
  }
  return 0;
}

Assistant:

static int      stbi__pnm_info(stbi__context *s, int *x, int *y, int *comp)
{
   int maxv, dummy;
   char c, p, t;

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   stbi__rewind(s);

   // Get identifier
   p = (char) stbi__get8(s);
   t = (char) stbi__get8(s);
   if (p != 'P' || (t != '5' && t != '6')) {
       stbi__rewind(s);
       return 0;
   }

   *comp = (t == '6') ? 3 : 1;  // '5' is 1-component .pgm; '6' is 3-component .ppm

   c = (char) stbi__get8(s);
   stbi__pnm_skip_whitespace(s, &c);

   *x = stbi__pnm_getinteger(s, &c); // read width
   stbi__pnm_skip_whitespace(s, &c);

   *y = stbi__pnm_getinteger(s, &c); // read height
   stbi__pnm_skip_whitespace(s, &c);

   maxv = stbi__pnm_getinteger(s, &c);  // read max value

   if (maxv > 255)
      return stbi__err("max value > 255", "PPM image not 8-bit");
   else
      return 1;
}